

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

uchar * __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocateArrayZ<unsigned_char>
          (SlabAllocatorBase<0> *this,size_t count)

{
  byte *__s;
  uchar *puVar1;
  
  if (count < 0x1001) {
    __s = SlabAllocateRawSize<true,true>(this,count);
  }
  else {
    __s = SlabAllocateLargeBlockSize<true>(this,count);
  }
  puVar1 = (uchar *)memset(__s,0,count);
  return puVar1;
}

Assistant:

T* SlabAllocateArrayZ(size_t count)
        {
            T* res = nullptr;

            size_t size = count * sizeof(T);
            if (size <= TTD_SLAB_LARGE_BLOCK_SIZE)
            {
                res = (T*)this->SlabAllocateRawSize<true, true>(size);
            }
            else
            {
                res = (T*)this->SlabAllocateLargeBlockSize<true>(size);
            }

            memset(res, 0, size);
            return res;
        }